

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O2

void squall::detail::defun_global<void,std::shared_ptr<Foo>>
               (HSQUIRRELVM vm,HSQOBJECT *table,string *name,
               function<void_(std::shared_ptr<Foo>)> *f)

{
  HSQOBJECT obj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  obj._4_4_ = 0;
  obj._type = table->_type;
  obj._unVal.pTable = (table->_unVal).pTable;
  sq_pushobject(vm,obj);
  TypeMaskList<std::shared_ptr<Foo>>::doit_abi_cxx11_();
  std::operator+(&local_60,".",&local_40);
  defun<2,void,std::shared_ptr<Foo>>(vm,name,f,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  sq_pop(vm,1);
  return;
}

Assistant:

void defun_global(
    HSQUIRRELVM vm, const HSQOBJECT& table,
    const string& name, const std::function<R (T...)>& f) {

    sq_pushobject(vm, table);
    defun<2>(vm, name, f, _SC(".") + TypeMaskList<T...>::doit());
    sq_pop(vm, 1);
}